

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

SourceCodeInfo_Location * __thiscall
google::protobuf::FileDescriptorTables::GetSourceLocation
          (FileDescriptorTables *this,vector<int,_std::allocator<int>_> *path,SourceCodeInfo *info)

{
  second_type pSVar1;
  char *in_RCX;
  string local_58;
  FileDescriptorTables *local_38;
  undefined1 local_30 [8];
  pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*> p;
  SourceCodeInfo *info_local;
  vector<int,_std::allocator<int>_> *path_local;
  FileDescriptorTables *this_local;
  
  local_38 = this;
  p.second = info;
  _local_30 = std::
              make_pair<google::protobuf::FileDescriptorTables_const*,google::protobuf::SourceCodeInfo_const*&>
                        (&local_38,&p.second);
  GoogleOnceDynamic::
  Init<std::pair<google::protobuf::FileDescriptorTables_const*,google::protobuf::SourceCodeInfo_const*>>
            (&this->locations_by_path_once_,BuildLocationsByPath,
             (pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*>
              *)local_30);
  Join<std::vector<int,std::allocator<int>>>
            (&local_58,(protobuf *)path,(vector<int,_std::allocator<int>_> *)0x5ddd86,in_RCX);
  pSVar1 = FindPtrOrNull<google::protobuf::hash_map<std::__cxx11::string,google::protobuf::SourceCodeInfo_Location_const*,google::protobuf::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::SourceCodeInfo_Location_const*>>>>
                     (&this->locations_by_path_,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return pSVar1;
}

Assistant:

const SourceCodeInfo_Location* FileDescriptorTables::GetSourceLocation(
    const std::vector<int>& path, const SourceCodeInfo* info) const {
  std::pair<const FileDescriptorTables*, const SourceCodeInfo*> p(
      std::make_pair(this, info));
  locations_by_path_once_.Init(&FileDescriptorTables::BuildLocationsByPath, &p);
  return FindPtrOrNull(locations_by_path_, Join(path, ","));
}